

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppRole.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::AppRole::deleteRoleProperty
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,AppRole *this,Path *roleName,Path *propertyName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Client *client;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Path local_68;
  Url local_48;
  
  client = *(Client **)this;
  std::operator+(&local_88,&roleName->value_,&propertyName->value_);
  paVar1 = &local_68.value_.field_2;
  paVar2 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar2) {
    local_68.value_.field_2._8_8_ = local_88.field_2._8_8_;
    local_68.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.value_._M_dataplus._M_p = local_88._M_dataplus._M_p;
  }
  local_68.value_.field_2._M_allocated_capacity._1_7_ = local_88.field_2._M_allocated_capacity._1_7_
  ;
  local_68.value_.field_2._M_local_buf[0] = local_88.field_2._M_local_buf[0];
  local_68.value_._M_string_length = local_88._M_string_length;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)paVar2;
  getUrl(&local_48,this,&local_68);
  HttpConsumer::del(__return_storage_ptr__,client,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.value_._M_dataplus._M_p != &local_48.value_.field_2) {
    operator_delete(local_48.value_._M_dataplus._M_p,
                    local_48.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.value_._M_dataplus._M_p,
                    local_68.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::AppRole::deleteRoleProperty(const Path &roleName,
                                   const Path &propertyName) const {
  return HttpConsumer::del(client_, getUrl(Path{roleName + propertyName}));
}